

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

void anon_unknown.dwarf_e6eb::eatExpectedString(istream *in,char *str)

{
  char cVar1;
  istream *piVar2;
  KatException *this;
  char c;
  string msg;
  
  do {
    if (*str == '\0') {
      return;
    }
    piVar2 = std::operator>>(in,&c);
  } while ((((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) == 0) &&
          (cVar1 = *str, str = str + 1, c == cVar1));
  msg._M_dataplus._M_p = (pointer)&msg.field_2;
  msg._M_string_length = 0;
  msg.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::append((char *)&msg);
  std::__cxx11::string::append((ulong)&msg,'\x01');
  std::__cxx11::string::append((char *)&msg);
  this = (KatException *)__cxa_allocate_exception(0x10);
  KatException::KatException(this,&msg);
  __cxa_throw(this,&(anonymous_namespace)::KatException::typeinfo,std::runtime_error::~runtime_error
             );
}

Assistant:

void eatExpectedString(std::istream &in, const char *str)
    {
        char c;
        while (*str != '\0')
        {
            if (!(in >> c) || c != *str)
            {
                std::string msg;
                msg.append("unexpected character '");
                msg.append(1, c);
                msg.append("'");
                throw KatException(msg);
            }
            ++str;
        }
    }